

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O0

bool sptk::SnPrintf<sptk::uint24_t>
               (uint24_t *data,string *print_format,size_t buffer_size,char *buffer)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  char *__format;
  char *in_RCX;
  size_t in_RDX;
  uint24_t *in_RDI;
  undefined1 local_1;
  
  uVar3 = std::__cxx11::string::empty();
  if ((((uVar3 & 1) == 0) && (in_RDX != 0)) && (in_RCX != (char *)0x0)) {
    __format = (char *)std::__cxx11::string::c_str();
    uVar1 = uint24_t::operator_cast_to_int(in_RDI);
    iVar2 = snprintf(in_RCX,in_RDX,__format,(ulong)uVar1);
    local_1 = -1 < iVar2;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SnPrintf(uint24_t data, const std::string& print_format,
              std::size_t buffer_size, char* buffer) {
  if (print_format.empty() || 0 == buffer_size || NULL == buffer) {
    return false;
  }

  return (std::snprintf(buffer, buffer_size, print_format.c_str(),
                        static_cast<int>(data)) < 0)
             ? false
             : true;
}